

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool ON_SubDEdgeSharpness::EqualTrend(ON_SubDEdgePtr *eptr0,ON_SubDEdgePtr *eptr1)

{
  long lVar1;
  ON_SubDEdgeSharpness s0;
  ON_SubDEdgeSharpness s1;
  bool bVar2;
  ON_SubDEdge *edge_1;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = eptr0->m_ptr & 0xfffffffffffffff8;
  uVar3 = eptr1->m_ptr & 0xfffffffffffffff8;
  if ((((uVar4 != uVar3) && (uVar4 != 0)) && (uVar3 != 0)) &&
     (((*(char *)(uVar4 + 0x60) == *(char *)(uVar3 + 0x60) &&
       (lVar1 = *(long *)(uVar4 + 0x80 + (ulong)(~(uint)eptr0->m_ptr & 1) * 8), lVar1 != 0)) &&
      (lVar1 == *(long *)(uVar3 + 0x80 + (ulong)((uint)eptr1->m_ptr & 1) * 8))))) {
    s0 = ON_SubDEdgePtr::RelativeSharpness(eptr0,true);
    s1 = ON_SubDEdgePtr::RelativeSharpness(eptr1,true);
    bVar2 = EqualTrend(s0,s1);
    return bVar2;
  }
  return false;
}

Assistant:

bool ON_SubDEdgeSharpness::EqualTrend(
  const ON_SubDEdgePtr& eptr0,
  const ON_SubDEdgePtr& eptr1
)
{
  const ON_SubDEdge* e[2] = { eptr0.Edge(), eptr1.Edge() };
  if (nullptr == e[0] || nullptr == e[1] || e[0] == e[1])
    return false;

  if (e[0]->m_edge_tag != e[1]->m_edge_tag)
    return false;

  const ON_SubDVertex* v = eptr0.RelativeVertex(1);
  if (nullptr == v)
    return false;
  if (v != eptr1.RelativeVertex(0))
    return false;

  return ON_SubDEdgeSharpness::EqualTrend(eptr0.RelativeSharpness(true), eptr1.RelativeSharpness(true));
}